

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseMinimizer.cpp
# Opt level: O0

void __thiscall TraverseMinimizer::dfs(TraverseMinimizer *this,Node *node)

{
  value_type pNVar1;
  bool bVar2;
  void *pvVar3;
  reference ppNVar4;
  iterator marked;
  reference ppNVar5;
  Node *neighbor;
  iterator __end2;
  iterator __begin2;
  NodeList *__range2;
  value_type v;
  stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *pile;
  vector<Node_*,_std::allocator<Node_*>_> *in_stack_ffffffffffffff88;
  stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *in_stack_ffffffffffffff90;
  TraverseMinimizer *this_00;
  
  pvVar3 = operator_new(0x50);
  std::stack<Node*,std::deque<Node*,std::allocator<Node*>>>::
  stack<std::deque<Node*,std::allocator<Node*>>,void>(in_stack_ffffffffffffff90);
  std::stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::push
            (in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
  while (bVar2 = std::stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::empty
                           ((stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)0x104011)
        , ((bVar2 ^ 0xffU) & 1) != 0) {
    ppNVar4 = std::stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::top
                        ((stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)0x104026);
    pNVar1 = *ppNVar4;
    std::stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::pop
              ((stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)0x104038);
    if ((pNVar1->visited & 1U) == 0) {
      pNVar1->visited = true;
      this_00 = (TraverseMinimizer *)&pNVar1->neighbors;
      marked = std::vector<Node_*,_std::allocator<Node_*>_>::begin(in_stack_ffffffffffffff88);
      std::vector<Node_*,_std::allocator<Node_*>_>::end(in_stack_ffffffffffffff88);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                 *)in_stack_ffffffffffffff90,
                                (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                 *)in_stack_ffffffffffffff88), bVar2) {
        ppNVar5 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                             *)&stack0xffffffffffffffb8);
        if (((*ppNVar5)->marked & 1U) == 0) {
          if (((*ppNVar5)->visited & 1U) == 0) {
            std::stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::push
                      (in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
          }
        }
        else {
          removeMark(this_00,(Node *)marked._M_current);
        }
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                   &stack0xffffffffffffffb8);
      }
    }
  }
  if (pvVar3 != (void *)0x0) {
    std::stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::~stack
              ((stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)0x104121);
    operator_delete(pvVar3);
  }
  return;
}

Assistant:

void TraverseMinimizer::dfs(Node& node) {
    auto pile = new std::stack<Node*>;
    pile->push(&node);

    while (!pile->empty()) {
        auto v = pile->top();
        pile->pop();

        if (v->visited) continue;
        v->visited = true;

        for (auto neighbor : v->neighbors) {
            if (neighbor->marked) {
                removeMark(*neighbor);
                continue;
            }
            if (neighbor->visited) continue;
            pile->push(neighbor);
        }
    }
    delete pile;
}